

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

string * __thiscall ghc::net::uri::str_abi_cxx11_(string *__return_storage_ptr__,uri *this)

{
  size_type sVar1;
  ostream *poVar2;
  string authTemp;
  stringstream result;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  sVar1 = (this->_scheme)._M_string_length;
  if (sVar1 != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->_scheme)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  }
  authority_abi_cxx11_(&local_1c0,this);
  if (local_1c0._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"//",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(this->_path)._M_dataplus._M_p,(this->_path)._M_string_length);
  if ((this->_query)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"?",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->_query)._M_dataplus._M_p,(this->_query)._M_string_length)
    ;
  }
  if ((this->_fragment)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"#",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->_fragment)._M_dataplus._M_p,
               (this->_fragment)._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string uri::str() const
{
    std::stringstream result;
    if (!_scheme.empty()) {
        result << _scheme << ":";
    }
    std::string authTemp = authority();
    if (!authTemp.empty()) {
        result << "//" << authTemp;
    }
    result << _path;
    if (!_query.empty()) {
        result << "?" << _query;
    }
    if (!_fragment.empty()) {
        result << "#" << fragment();
    }
    return result.str();
}